

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

void __thiscall
CompilerContext::compile_command(CompilerContext *this,SyntaxTree *command_node,bool not_flag)

{
  vtable_type *pvVar1;
  bool bVar2;
  type_info *ptVar3;
  ReplacedCommandAnnotation *pRVar4;
  reference_wrapper<const_Command> rhs;
  Command *command;
  Command *extraout_RDX;
  Command *extraout_RDX_00;
  Command *pCVar5;
  ArgList *__return_storage_ptr__;
  optional<const_ReplacedCommandAnnotation_&> opt_annot;
  optional<const_ReplacedCommandAnnotation_&> local_a0;
  __shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2> local_98;
  __shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2> local_80;
  optional<const_Command_&> local_70;
  optional<const_Command_&> local_68;
  ArgList local_60;
  ArgList local_48;
  
  pvVar1 = (command_node->udata).vtable;
  if ((pvVar1 != (vtable_type *)0x0) &&
     (ptVar3 = (*pvVar1->type)(), ptVar3 == (type_info *)&DummyCommandAnnotation::typeinfo)) {
    return;
  }
  local_a0.ref = linb::any_cast<ReplacedCommandAnnotation_const>(&command_node->udata);
  if (local_a0.ref == (ReplacedCommandAnnotation *)0x0) {
    rhs = linb::any_cast<std::reference_wrapper<Command_const>>(&command_node->udata);
    local_70.ref = (this->commands->skip_cutscene_end).ref;
    bVar2 = Commands::equal(this->commands,rhs._M_data,&local_70);
    pCVar5 = extraout_RDX;
    if ((bVar2) &&
       ((this->label_skip_cutscene_end).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0)) {
      std::__shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_80,
                 &(this->label_skip_cutscene_end).
                  super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>);
      std::vector<CompiledData,std::allocator<CompiledData>>::emplace_back<std::shared_ptr<Label>>
                ((vector<CompiledData,std::allocator<CompiledData>> *)&this->compiled,
                 (shared_ptr<Label> *)&local_80);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
      local_98._M_ptr = (element_type *)0x0;
      local_98._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->label_skip_cutscene_end).
                  super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>,&local_98);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
      pCVar5 = extraout_RDX_00;
    }
    __return_storage_ptr__ = &local_60;
    get_args(__return_storage_ptr__,this,pCVar5,command_node);
    compile_command(this,rhs._M_data,__return_storage_ptr__,not_flag);
  }
  else {
    pRVar4 = std::experimental::optional<const_ReplacedCommandAnnotation_&>::operator->(&local_a0);
    pCVar5 = pRVar4->command;
    local_68.ref = (this->commands->skip_cutscene_start_internal).ref;
    bVar2 = Commands::equal(this->commands,pCVar5,&local_68);
    if (bVar2) {
      pRVar4 = std::experimental::optional<const_ReplacedCommandAnnotation_&>::operator->(&local_a0)
      ;
      linb::any_cast<std::shared_ptr<Label>>
                ((linb *)&local_98,
                 (pRVar4->params).super__Vector_base<linb::any,_std::allocator<linb::any>_>._M_impl.
                 super__Vector_impl_data._M_start);
      std::__shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->label_skip_cutscene_end).
                  super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>,&local_98);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
    }
    std::experimental::optional<const_ReplacedCommandAnnotation_&>::operator->(&local_a0);
    pRVar4 = std::experimental::optional<const_ReplacedCommandAnnotation_&>::operator->(&local_a0);
    __return_storage_ptr__ = &local_48;
    get_args(__return_storage_ptr__,this,command,&pRVar4->params);
    compile_command(this,pCVar5,__return_storage_ptr__,false);
  }
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::~vector(__return_storage_ptr__);
  return;
}

Assistant:

void CompilerContext::compile_command(const SyntaxTree& command_node, bool not_flag)
{
    if(command_node.maybe_annotation<DummyCommandAnnotation>())
    {
        // compile nothing
    }
    else if(auto opt_annot = command_node.maybe_annotation<const ReplacedCommandAnnotation&>())
    {
        const Command& command = opt_annot->command;

        if(commands.equal(command, commands.skip_cutscene_start_internal))
        {
            this->label_skip_cutscene_end = any_cast<shared_ptr<Label>>(opt_annot->params[0]);
        }

        compile_command(command, get_args(opt_annot->command, opt_annot->params));
    }
    else
    {
        const Command& command = command_node.annotation<std::reference_wrapper<const Command>>();

        if(commands.equal(command, commands.skip_cutscene_end) && this->label_skip_cutscene_end)
        {
            compile_label(this->label_skip_cutscene_end);
            this->label_skip_cutscene_end = nullptr;
        }

        compile_command(command, get_args(command, command_node), not_flag);
    }
}